

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_three_reg_same(DisasContext_conflict1 *s,uint32_t insn)

{
  uint32_t opcode_00;
  uint32_t is_q_00;
  uint32_t u_00;
  uint32_t size_00;
  uint32_t rm_00;
  uint32_t rn_00;
  uint32_t rd_00;
  int rd;
  int rn;
  int rm;
  int size;
  int u;
  int is_q;
  int opcode;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  opcode_00 = extract32(insn,0xb,5);
  if (opcode_00 == 3) {
    disas_simd_3same_logic(s,insn);
  }
  else if ((opcode_00 - 0x14 < 2) || (opcode_00 == 0x17)) {
    is_q_00 = extract32(insn,0x1e,1);
    u_00 = extract32(insn,0x1d,1);
    size_00 = extract32(insn,0x16,2);
    rm_00 = extract32(insn,0x10,5);
    rn_00 = extract32(insn,5,5);
    rd_00 = extract32(insn,0,5);
    if (opcode_00 == 0x17) {
      if ((u_00 != 0) || ((size_00 == 3 && (is_q_00 == 0)))) {
        unallocated_encoding_aarch64(s);
        return;
      }
    }
    else if (size_00 == 3) {
      unallocated_encoding_aarch64(s);
      return;
    }
    handle_simd_3same_pair(s,is_q_00,u_00,opcode_00,size_00,rn_00,rm_00,rd_00);
  }
  else if (opcode_00 - 0x18 < 0x1a) {
    disas_simd_3same_float(s,insn);
  }
  else {
    disas_simd_3same_int(s,insn);
  }
  return;
}

Assistant:

static void disas_simd_three_reg_same(DisasContext *s, uint32_t insn)
{
    int opcode = extract32(insn, 11, 5);

    switch (opcode) {
    case 0x3: /* logic ops */
        disas_simd_3same_logic(s, insn);
        break;
    case 0x17: /* ADDP */
    case 0x14: /* SMAXP, UMAXP */
    case 0x15: /* SMINP, UMINP */
    {
        /* Pairwise operations */
        int is_q = extract32(insn, 30, 1);
        int u = extract32(insn, 29, 1);
        int size = extract32(insn, 22, 2);
        int rm = extract32(insn, 16, 5);
        int rn = extract32(insn, 5, 5);
        int rd = extract32(insn, 0, 5);
        if (opcode == 0x17) {
            if (u || (size == 3 && !is_q)) {
                unallocated_encoding(s);
                return;
            }
        } else {
            if (size == 3) {
                unallocated_encoding(s);
                return;
            }
        }
        handle_simd_3same_pair(s, is_q, u, opcode, size, rn, rm, rd);
        break;
    }
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
        /* floating point ops, sz[1] and U are part of opcode */
        disas_simd_3same_float(s, insn);
        break;
    default:
        disas_simd_3same_int(s, insn);
        break;
    }
}